

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O0

int __thiscall
jrtplib::RTCPCompoundPacketBuilder::AddSDESNormalItem
          (RTCPCompoundPacketBuilder *this,ItemType t,void *itemdata,uint8_t itemlength)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  RTPMemoryManager *mgr;
  uint8_t *buf_00;
  RTCPSDESHeader *sdeshdr;
  size_t len;
  uint8_t *buf;
  size_t sdessizewithextraitem;
  size_t totalotherbytes;
  uint8_t itemid;
  uint8_t itemlength_local;
  void *itemdata_local;
  ItemType t_local;
  RTCPCompoundPacketBuilder *this_local;
  
  if ((this->arebuilding & 1U) == 0) {
    this_local._4_4_ = -0x2a;
  }
  else {
    bVar3 = std::__cxx11::
            list<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
            ::empty(&(this->sdes).sdessources);
    if (bVar3) {
      this_local._4_4_ = -0x28;
    }
    else {
      switch(t) {
      case CNAME:
        totalotherbytes._6_1_ = '\x01';
        break;
      case NAME:
        totalotherbytes._6_1_ = '\x02';
        break;
      case EMAIL:
        totalotherbytes._6_1_ = '\x03';
        break;
      case PHONE:
        totalotherbytes._6_1_ = '\x04';
        break;
      case LOC:
        totalotherbytes._6_1_ = '\x05';
        break;
      case TOOL:
        totalotherbytes._6_1_ = '\x06';
        break;
      case NOTE:
        totalotherbytes._6_1_ = '\a';
        break;
      default:
        return -0x26;
      }
      sVar1 = this->byesize;
      sVar2 = this->appsize;
      sVar4 = Report::NeededBytes(&this->report);
      sVar5 = SDES::NeededBytesWithExtraItem(&this->sdes,itemlength);
      if (this->maximumpacketsize < sVar5 + sVar1 + sVar2 + sVar4) {
        this_local._4_4_ = -0x2b;
      }
      else {
        mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
        buf_00 = (uint8_t *)operator_new__((ulong)itemlength + 2,mgr,7);
        if (buf_00 == (uint8_t *)0x0) {
          this_local._4_4_ = -1;
        }
        else {
          *buf_00 = totalotherbytes._6_1_;
          buf_00[1] = itemlength;
          if (itemlength != '\0') {
            memcpy(buf_00 + 2,itemdata,(ulong)itemlength);
          }
          SDES::AddItem(&this->sdes,buf_00,(ulong)itemlength + 2);
          this_local._4_4_ = 0;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTCPCompoundPacketBuilder::AddSDESNormalItem(RTCPSDESPacket::ItemType t,const void *itemdata,uint8_t itemlength)
{
	if (!arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTBUILDING;
	if (sdes.sdessources.empty())
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOCURRENTSOURCE;

	uint8_t itemid;
	
	switch(t)
	{
	case RTCPSDESPacket::CNAME:
		itemid = RTCP_SDES_ID_CNAME;
		break;
	case RTCPSDESPacket::NAME:
		itemid = RTCP_SDES_ID_NAME;
		break;
	case RTCPSDESPacket::EMAIL:
		itemid = RTCP_SDES_ID_EMAIL;
		break;
	case RTCPSDESPacket::PHONE:
		itemid = RTCP_SDES_ID_PHONE;
		break;
	case RTCPSDESPacket::LOC:
		itemid = RTCP_SDES_ID_LOCATION;
		break;
	case RTCPSDESPacket::TOOL:
		itemid = RTCP_SDES_ID_TOOL;
		break;
	case RTCPSDESPacket::NOTE:
		itemid = RTCP_SDES_ID_NOTE;
		break;
	default:
		return ERR_RTP_RTCPCOMPPACKBUILDER_INVALIDITEMTYPE;
	}

#ifndef RTP_SUPPORT_RTCPUNKNOWN
	size_t totalotherbytes = byesize+appsize+report.NeededBytes();
#else
	size_t totalotherbytes = byesize+appsize+unknownsize+report.NeededBytes();
#endif // RTP_SUPPORT_RTCPUNKNOWN 
	size_t sdessizewithextraitem = sdes.NeededBytesWithExtraItem(itemlength);

	if ((sdessizewithextraitem+totalotherbytes) > maximumpacketsize)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT;

	uint8_t *buf;
	size_t len;

	buf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTCPSDESBLOCK) uint8_t[sizeof(RTCPSDESHeader)+(size_t)itemlength];
	if (buf == 0)
		return ERR_RTP_OUTOFMEM;
	len = sizeof(RTCPSDESHeader)+(size_t)itemlength;

	RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(buf);

	sdeshdr->sdesid = itemid;
	sdeshdr->length = itemlength;
	if (itemlength != 0)
		memcpy((buf + sizeof(RTCPSDESHeader)),itemdata,(size_t)itemlength);

	sdes.AddItem(buf,len);
	return 0;
}